

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback-queue.cc
# Opt level: O0

void __thiscall
capture_thread::testing::CallbackQueue::Push(CallbackQueue *this,function<void_()> *callback)

{
  value_type *in_RSI;
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  *in_RDI;
  lock_guard<std::mutex> lock;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_RSI);
  if ((in_RDI[1].c.
       super__Deque_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
       super__Deque_impl_data._M_map_size & 0x100000000) == 0) {
    std::
    queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
    ::push(in_RDI,in_RSI);
    std::condition_variable::notify_all();
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1165e9);
  return;
}

Assistant:

void CallbackQueue::Push(std::function<void()> callback) {
  std::lock_guard<std::mutex> lock(queue_lock_);
  if (!terminated_) {
    queue_.push(std::move(callback));
    condition_.notify_all();
  }
}